

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_fexp2_df_mipsel
               (CPUMIPSState_conflict4 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  int32_t *piVar1;
  float_status *pfVar2;
  byte bVar3;
  int n;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  float32 fVar8;
  float64 fVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  float_status *status;
  uint32_t unaff_retaddr;
  wr_t wx;
  float64 local_40 [2];
  
  lVar4 = (ulong)ws * 0x10 + 0x228;
  lVar5 = (ulong)wt * 0x10 + 0x228;
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar15 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      n = *(int *)((long)(env->active_fpu).fpr + lVar15 * 4 + lVar5 + -0x228);
      if (n < -0x1ff) {
        n = -0x200;
      }
      if (0x1ff < n) {
        n = 0x200;
      }
      fVar8 = float32_scalbn_mipsel
                        (*(float32 *)((long)(env->active_fpu).fpr + lVar15 * 4 + lVar4 + -0x228),n,
                         pfVar2);
      *(float32 *)((long)local_40 + lVar15 * 4) = fVar8;
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar14 = (uint)bVar3;
      if ((fVar8 & 0x7f800000) == 0) {
        uVar14 = uVar14 | 0x10;
      }
      if ((fVar8 & 0x7fffffff) == 0) {
        uVar14 = (uint)bVar3;
      }
      uVar6 = ieee_ex_to_mips_mipsel(uVar14);
      uVar10 = (env->active_tc).msacsr;
      uVar13 = (uVar10 & 0x1000000) >> 0x18 & uVar14 >> 6;
      uVar11 = 3;
      if ((uVar10 & 0x1000000) == 0) {
        uVar11 = uVar13;
      }
      if (uVar14 < 0x80) {
        uVar11 = uVar13;
      }
      uVar11 = uVar11 | uVar6;
      uVar7 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar6 >> 2);
      uVar13 = uVar7 | uVar11;
      uVar14 = uVar6 & 0xfffffffc;
      if ((uVar7 != 0 || (uVar11 & 1) != 0) || (uVar10 & 0x100) != 0) {
        uVar14 = uVar13;
      }
      if ((uVar11 & 2) == 0) {
        uVar14 = uVar13;
      }
      if ((uVar14 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
        uVar11 = uVar14 << 0xc;
LAB_0081f176:
        (env->active_tc).msacsr = uVar11 & 0x3f000 | uVar10;
      }
      else if ((uVar10 >> 0x12 & 1) == 0) {
        uVar11 = uVar14 << 0xc | uVar10;
        uVar10 = uVar10 & 0xfff80fff;
        goto LAB_0081f176;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar14) != 0) {
        fVar8 = float32_default_nan_mipsel(pfVar2);
        *(float32 *)((long)local_40 + lVar15 * 4) = fVar8 & 0xffffffc0 ^ 0x400000 | uVar14;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1986,
                    "void helper_msa_fexp2_df_mipsel(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                   );
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar15 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      lVar12 = *(long *)((long)(env->active_fpu).fpr + lVar15 * 8 + lVar5 + -0x228);
      if (lVar12 < -0xfff) {
        lVar12 = -0x1000;
      }
      if (0xfff < lVar12) {
        lVar12 = 0x1000;
      }
      fVar9 = float64_scalbn_mipsel
                        (*(float64 *)((long)(env->active_fpu).fpr + lVar15 * 8 + lVar4 + -0x228),
                         (int)lVar12,pfVar2);
      local_40[lVar15] = fVar9;
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar14 = (uint)bVar3;
      if ((fVar9 & 0x7ff0000000000000) == 0) {
        uVar14 = uVar14 | 0x10;
      }
      if ((fVar9 & 0x7fffffffffffffff) == 0) {
        uVar14 = (uint)bVar3;
      }
      uVar6 = ieee_ex_to_mips_mipsel(uVar14);
      uVar10 = (env->active_tc).msacsr;
      uVar13 = (uVar10 & 0x1000000) >> 0x18 & uVar14 >> 6;
      uVar11 = 3;
      if ((uVar10 & 0x1000000) == 0) {
        uVar11 = uVar13;
      }
      if (uVar14 < 0x80) {
        uVar11 = uVar13;
      }
      uVar11 = uVar11 | uVar6;
      uVar7 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar6 >> 2);
      uVar13 = uVar7 | uVar11;
      uVar14 = uVar6 & 0xfffffffc;
      if ((uVar7 != 0 || (uVar11 & 1) != 0) || (uVar10 & 0x100) != 0) {
        uVar14 = uVar13;
      }
      if ((uVar11 & 2) == 0) {
        uVar14 = uVar13;
      }
      if ((uVar14 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
        uVar11 = uVar14 << 0xc;
LAB_0081f01f:
        (env->active_tc).msacsr = uVar11 & 0x3f000 | uVar10;
      }
      else if ((uVar10 >> 0x12 & 1) == 0) {
        uVar11 = uVar14 << 0xc | uVar10;
        uVar10 = uVar10 & 0xfff80fff;
        goto LAB_0081f01f;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar14) != 0) {
        fVar9 = float64_default_nan_mipsel(pfVar2);
        local_40[lVar15] = (long)(int)uVar14 | fVar9 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 == 1);
  }
  uVar14 = (env->active_tc).msacsr;
  uVar10 = uVar14 >> 7 & 0x1f | 0x20;
  if ((uVar10 & uVar14 >> 0xc) != 0) {
    do_raise_exception(env,unaff_retaddr,(ulong)uVar10);
  }
  (env->active_tc).msacsr = (uVar14 >> 0xc & 0x1f) << 2 | uVar14;
  (env->active_fpu).fpr[wd].fd = local_40[0];
  *(float64 *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = local_40[1];
  return;
}

Assistant:

void helper_msa_fexp2_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
        uint32_t ws, uint32_t wt)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_BINOP(pwx->w[i], scalbn, pws->w[i],
                            pwt->w[i] >  0x200 ?  0x200 :
                            pwt->w[i] < -0x200 ? -0x200 : pwt->w[i],
                            32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_BINOP(pwx->d[i], scalbn, pws->d[i],
                            pwt->d[i] >  0x1000 ?  0x1000 :
                            pwt->d[i] < -0x1000 ? -0x1000 : pwt->d[i],
                            64);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}